

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

char * fy_node_get_short_path(fy_node *fyn)

{
  fy_node *fyn_parent;
  long lVar1;
  long lVar2;
  size_t __maxlen;
  int iVar3;
  int iVar4;
  fy_anchor *pfVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  char *__dest;
  char *pcVar11;
  undefined8 uStack_60;
  char acStack_58 [12];
  int local_4c;
  uint local_48 [2];
  size_t len;
  char *local_38;
  
  pcVar7 = acStack_58;
  if (fyn != (fy_node *)0x0) {
    uStack_60 = 0x122ca8;
    pfVar5 = fy_node_get_nearest_anchor(fyn);
    if (pfVar5 == (fy_anchor *)0x0) {
      pcVar7 = fy_node_get_path(fyn);
      return pcVar7;
    }
    fyn_parent = pfVar5->fyn;
    uStack_60 = 0x122cc2;
    pcVar6 = fy_token_get_text(pfVar5->anchor,(size_t *)local_48);
    if (pcVar6 != (char *)0x0) {
      if (fyn_parent == fyn) {
        uStack_60 = 0x122d65;
        iVar3 = snprintf((char *)0x0,0,"*%.*s",(ulong)local_48[0],pcVar6);
        pcVar11 = (char *)0x0;
        if (iVar3 != -1) {
          lVar1 = -((long)iVar3 + 0x10U & 0xfffffffffffffff0);
          pcVar7 = acStack_58 + lVar1;
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x122d9f;
          iVar4 = snprintf(pcVar7,(long)iVar3 + 1,"*%.*s",(ulong)local_48[0],pcVar6);
          if (iVar3 != iVar4) {
            *(code **)((long)&uStack_60 + lVar1) = fy_node_build_from_string;
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                          ,0x116b,"char *fy_node_get_short_path(struct fy_node *)");
          }
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x122db0;
          sVar8 = strlen(pcVar7);
          pcVar11 = pcVar7;
          if (0 < (long)sVar8) {
            pcVar6 = pcVar7 + sVar8;
            do {
              if (pcVar6[-1] != '\n') break;
              pcVar6 = pcVar6 + -1;
              *pcVar6 = '\0';
            } while (pcVar7 < pcVar6);
          }
        }
      }
      else {
        len = CONCAT44(len._4_4_,local_48[0]);
        uStack_60 = 0x122ce0;
        pcVar7 = fy_node_get_path_relative_to(fyn_parent,fyn);
        if (pcVar7 == (char *)0x0) {
          pcVar11 = (char *)0x0;
          pcVar7 = acStack_58;
        }
        else {
          uStack_60 = 0x122cf4;
          sVar8 = strlen(pcVar7);
          lVar1 = -(sVar8 + 0x10 & 0xfffffffffffffff0);
          pcVar11 = acStack_58 + lVar1;
          local_38 = pcVar6;
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x122d1a;
          memcpy(pcVar11,pcVar7,sVar8);
          pcVar11[sVar8] = '\0';
          pcVar6 = local_38;
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x122d2b;
          free(pcVar7);
          pcVar7 = pcVar11;
        }
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "";
        }
        uVar10 = len & 0xffffffff;
        builtin_strncpy(pcVar7 + -8,"\x05.\x12",4);
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        iVar3 = snprintf((char *)0x0,0,"*%.*s/%s",uVar10,pcVar6,pcVar11);
        pcVar11 = (char *)0x0;
        if (iVar3 != -1) {
          len = (long)iVar3 + 1;
          lVar1 = -((long)iVar3 + 0x10U & 0xfffffffffffffff0);
          pcVar11 = pcVar7 + lVar1;
          local_38 = (char *)CONCAT44(local_38._4_4_,local_48[0]);
          builtin_strncpy(pcVar7 + lVar1 + -8,"=.\x12",4);
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          pcVar9 = fy_node_get_path_relative_to(fyn_parent,fyn);
          if (pcVar9 == (char *)0x0) {
            __dest = (char *)0x0;
            pcVar7 = pcVar11;
          }
          else {
            builtin_strncpy(pcVar7 + lVar1 + -8,"M.\x12",4);
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            sVar8 = strlen(pcVar9);
            lVar2 = -(sVar8 + 0x10 & 0xfffffffffffffff0);
            __dest = pcVar11 + lVar2;
            local_4c = iVar3;
            builtin_strncpy(pcVar7 + lVar2 + lVar1 + -8,"v.\x12",4);
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            memcpy(__dest,pcVar9,sVar8);
            __dest[sVar8] = '\0';
            iVar3 = local_4c;
            __dest[-8] = -0x76;
            __dest[-7] = '.';
            __dest[-6] = '\x12';
            __dest[-5] = '\0';
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            free(pcVar9);
            pcVar7 = __dest;
          }
          __maxlen = len;
          pcVar9 = "";
          if (__dest != (char *)0x0) {
            pcVar9 = __dest;
          }
          uVar10 = (ulong)local_38 & 0xffffffff;
          pcVar7[-8] = -0x48;
          pcVar7[-7] = '.';
          pcVar7[-6] = '\x12';
          pcVar7[-5] = '\0';
          pcVar7[-4] = '\0';
          pcVar7[-3] = '\0';
          pcVar7[-2] = '\0';
          pcVar7[-1] = '\0';
          iVar4 = snprintf(pcVar11,__maxlen,"*%.*s/%s",uVar10,pcVar6,pcVar9);
          if (iVar3 != iVar4) {
            builtin_strncpy(pcVar7 + -8,"\x14/\x12",4);
            pcVar7[-4] = '\0';
            pcVar7[-3] = '\0';
            pcVar7[-2] = '\0';
            pcVar7[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                          ,0x116e,"char *fy_node_get_short_path(struct fy_node *)");
          }
          pcVar7[-8] = -0x3b;
          pcVar7[-7] = '.';
          pcVar7[-6] = '\x12';
          pcVar7[-5] = '\0';
          pcVar7[-4] = '\0';
          pcVar7[-3] = '\0';
          pcVar7[-2] = '\0';
          pcVar7[-1] = '\0';
          sVar8 = strlen(pcVar11);
          if (0 < (long)sVar8) {
            pcVar6 = pcVar11 + sVar8;
            do {
              if (pcVar6[-1] != '\n') break;
              pcVar6 = pcVar6 + -1;
              *pcVar6 = '\0';
            } while (pcVar11 < pcVar6);
          }
        }
      }
      pcVar7[-8] = -0x1a;
      pcVar7[-7] = '.';
      pcVar7[-6] = '\x12';
      pcVar7[-5] = '\0';
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      pcVar7 = strdup(pcVar11);
      return pcVar7;
    }
  }
  return (char *)0x0;
}

Assistant:

char *fy_node_get_short_path(struct fy_node *fyn) {
    struct fy_node *fyn_anchor;
    struct fy_anchor *fya;
    const char *text;
    size_t len;
    const char *str;
    char *path;

    if (!fyn)
        return NULL;

    /* get the nearest anchor traversing upwards */
    fya = fy_node_get_nearest_anchor(fyn);
    if (!fya)
        return fy_node_get_path(fyn);

    fyn_anchor = fy_anchor_node(fya);

    text = fy_anchor_get_text(fya, &len);
    if (!text)
        return NULL;

    if (fyn_anchor == fyn)
        str = alloca_sprintf("*%.*s", (int) len, text);
    else
        str = alloca_sprintf("*%.*s/%s", (int) len, text,
                             fy_node_get_path_relative_to_alloca(fyn_anchor, fyn));

    path = strdup(str);
    return path;
}